

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O3

void __thiscall
gmath::RationalTangentialThinPrismDistortion::RationalTangentialThinPrismDistortion
          (RationalTangentialThinPrismDistortion *this,Properties *prop,int id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int in_ECX;
  int iVar2;
  undefined4 in_register_00000014;
  string local_40;
  
  (this->super_Distortion)._vptr_Distortion = (_func_int **)&PTR__Distortion_00163ac8;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"p1",(char *)CONCAT44(in_register_00000014,id),
             in_ECX);
  iVar2 = 0x1527d1;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd,"0");
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"p2",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x1527d1;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 1,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k1",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x1527d1;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 2,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k2",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x1527d1;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 3,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k3",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x1527d1;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 4,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k4",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x1527d1;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 5,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k5",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x1527d1;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 6,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k6",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x1527d1;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 7,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"s1",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x1527d1;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 8,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"s2",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x1527d1;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 9,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"s3",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x1527d1;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 10,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"s4",(char *)(ulong)(uint)id,iVar2);
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 0xb,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

RationalTangentialThinPrismDistortion::RationalTangentialThinPrismDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("p1", id).c_str(), kd[0], "0");
  prop.getValue(getCameraKey("p2", id).c_str(), kd[1], "0");

  prop.getValue(getCameraKey("k1", id).c_str(), kd[2], "0");
  prop.getValue(getCameraKey("k2", id).c_str(), kd[3], "0");
  prop.getValue(getCameraKey("k3", id).c_str(), kd[4], "0");
  prop.getValue(getCameraKey("k4", id).c_str(), kd[5], "0");
  prop.getValue(getCameraKey("k5", id).c_str(), kd[6], "0");
  prop.getValue(getCameraKey("k6", id).c_str(), kd[7], "0");

  prop.getValue(getCameraKey("s1", id).c_str(), kd[8], "0");
  prop.getValue(getCameraKey("s2", id).c_str(), kd[9], "0");
  prop.getValue(getCameraKey("s3", id).c_str(), kd[10], "0");
  prop.getValue(getCameraKey("s4", id).c_str(), kd[11], "0");
}